

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

TailCallParseFunc google::protobuf::GetFastParseFunction(TcParseFunction func)

{
  long lVar1;
  _func_char_ptr_MessageLite_ptr_char_ptr_ParseContext_ptr_TcFieldData_TcParseTableBase_ptr_unsigned_long
  **pp_Var2;
  _func_char_ptr_MessageLite_ptr_char_ptr_ParseContext_ptr_TcFieldData_TcParseTableBase_ptr_unsigned_long
  **pp_Var3;
  LogMessage *pLVar4;
  LogMessage local_30;
  Voidify local_19;
  uint local_18;
  TcParseFunction local_11;
  int index;
  TcParseFunction func_local;
  
  local_18 = (uint)func;
  lVar1 = (long)(int)local_18;
  local_11 = func;
  pp_Var2 = __const_std__end<char_const*(*const)(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long),124ul>_char_const___const____124ul___google__protobuf__MessageLite__char_const__google__protobuf__internal__ParseContext__google__protobuf__internal__TcFieldData_google__protobuf__internal__TcParseTableBase_const__unsigned_long___
                      ((_func_char_ptr_MessageLite_ptr_char_ptr_ParseContext_ptr_TcFieldData_TcParseTableBase_ptr_unsigned_long
                        *(*) [124])GetFastParseFunction::kFuncs);
  pp_Var3 = __const_std__begin<char_const*(*const)(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long),124ul>_char_const___const____124ul___google__protobuf__MessageLite__char_const__google__protobuf__internal__ParseContext__google__protobuf__internal__TcFieldData_google__protobuf__internal__TcParseTableBase_const__unsigned_long___
                      ((_func_char_ptr_MessageLite_ptr_char_ptr_ParseContext_ptr_TcFieldData_TcParseTableBase_ptr_unsigned_long
                        *(*) [124])GetFastParseFunction::kFuncs);
  if ((lVar1 < (long)pp_Var2 - (long)pp_Var3 >> 3) &&
     (GetFastParseFunction::kFuncs[(int)local_18] != (TailCallParseFunc)0x0)) {
    _index = GetFastParseFunction::kFuncs[(int)local_18];
  }
  else {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd97);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [26])"Failed to find function: ");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(uint)local_11);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30);
    _index = internal::TcParser::MiniParse;
  }
  return _index;
}

Assistant:

static internal::TailCallParseFunc GetFastParseFunction(
    internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) internal::TcParser::value,
  static constexpr internal::TailCallParseFunc kFuncs[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int index = static_cast<int>(func);
  if (index < 0 || index >= std::end(kFuncs) - std::begin(kFuncs) ||
      kFuncs[index] == nullptr) {
    ABSL_DLOG(FATAL) << "Failed to find function: " << static_cast<int>(func);
    // Let's not crash in opt, just in case.
    // MiniParse is always a valid parser.
    return &internal::TcParser::MiniParse;
  }
  return kFuncs[index];
}